

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_cdef_mse_calc_frame_mt(AV1_COMP *cpi)

{
  uint uVar1;
  pthread_mutex_t *__mutex;
  AVxWorker *pAVar2;
  int iVar3;
  AVxWorkerInterface *pAVar4;
  AVxWorker *pAVar5;
  ulong uVar6;
  EncWorkerData *pEVar7;
  int iVar8;
  long lVar9;
  void **ppvVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  uVar1 = (cpi->mt_info).num_mod_workers[6];
  uVar11 = (ulong)uVar1;
  __mutex = (cpi->mt_info).cdef_sync.mutex_;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
  }
  *(undefined8 *)((long)&(cpi->mt_info).cdef_sync.fbr + 1) = 0;
  (cpi->mt_info).cdef_sync.end_of_frame = 0;
  (cpi->mt_info).cdef_sync.fbr = 0;
  if ((int)uVar1 < 1) {
    aom_get_worker_interface();
  }
  else {
    uVar6 = uVar11 + 1;
    pEVar7 = (cpi->mt_info).tile_thr_data + uVar11;
    ppvVar10 = &(cpi->mt_info).workers[uVar11 - 1].data2;
    do {
      pEVar7 = pEVar7 + -1;
      pEVar7->cpi = cpi;
      ppvVar10[-2] = cdef_filter_block_worker_hook;
      ppvVar10[-1] = pEVar7;
      *ppvVar10 = &(cpi->mt_info).cdef_sync;
      uVar6 = uVar6 - 1;
      ppvVar10 = ppvVar10 + -7;
    } while (1 < uVar6);
    pAVar4 = aom_get_worker_interface();
    lVar12 = uVar11 - 1;
    pAVar2 = (cpi->mt_info).workers;
    pAVar5 = pAVar2 + lVar12;
    pAVar2[lVar12].had_error = 0;
    if (lVar12 != 0) {
      lVar9 = uVar11 * -0x38 + 0x38;
      lVar13 = uVar11 * 0x38 + -0x40;
      do {
        (*pAVar4->launch)(pAVar5);
        lVar12 = lVar12 + -1;
        pAVar2 = (cpi->mt_info).workers;
        pAVar5 = pAVar2 + lVar12;
        *(undefined4 *)((long)&pAVar2->impl_ + lVar13) = 0;
        lVar9 = lVar9 + 0x38;
        lVar13 = lVar13 + -0x38;
      } while (lVar12 != 0);
      pAVar5 = (AVxWorker *)((long)pAVar2 - lVar9);
    }
    (*pAVar4->execute)(pAVar5);
  }
  pAVar4 = aom_get_worker_interface();
  pAVar5 = (cpi->mt_info).workers;
  iVar8 = pAVar5->had_error;
  if (iVar8 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar5->data1 + 0x18),0x1a0);
  }
  if (1 < (int)uVar1) {
    uVar6 = uVar11 + 1;
    lVar12 = uVar11 * 0x38;
    do {
      pAVar2 = (cpi->mt_info).workers;
      iVar3 = (*pAVar4->sync)((AVxWorker *)((long)&pAVar2[-1].impl_ + lVar12));
      if (iVar3 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar2[-1].data1 + lVar12) + 0x18),0x1a0);
        iVar8 = 1;
      }
      uVar6 = uVar6 - 1;
      lVar12 = lVar12 + -0x38;
    } while (2 < uVar6);
  }
  if (iVar8 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar5->data1 + 8) + 0x2b90) = (cpi->common).error;
  return;
}

Assistant:

void av1_cdef_mse_calc_frame_mt(AV1_COMP *cpi) {
  MultiThreadInfo *mt_info = &cpi->mt_info;
  AV1CdefSync *cdef_sync = &mt_info->cdef_sync;
  const int num_workers = mt_info->num_mod_workers[MOD_CDEF_SEARCH];

  cdef_reset_job_info(cdef_sync);
  prepare_cdef_workers(cpi, cdef_filter_block_worker_hook, num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, &cpi->common, num_workers);
}